

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_7::Validator::CheckFuncSignature
          (Validator *this,Location *loc,FuncDeclaration *decl)

{
  undefined4 in_EAX;
  Result RVar1;
  undefined4 in_register_00000004;
  FuncType *local_38;
  FuncType *func_type;
  
  if (decl->has_func_type == true) {
    local_38 = (FuncType *)CONCAT44(in_register_00000004,in_EAX);
    RVar1 = CheckFuncTypeVar(this,&decl->type_var,&local_38);
    if (RVar1.enum_ == Ok) {
      CheckTypes(this,loc,&(decl->sig).result_types,&(local_38->sig).result_types,"function",
                 "result");
      CheckTypes(this,loc,&(decl->sig).param_types,&(local_38->sig).param_types,"function",
                 "argument");
    }
  }
  return;
}

Assistant:

void Validator::CheckFuncSignature(const Location* loc,
                                   const FuncDeclaration& decl) {
  if (decl.has_func_type) {
    const FuncType* func_type;
    if (Succeeded(CheckFuncTypeVar(&decl.type_var, &func_type))) {
      CheckTypes(loc, decl.sig.result_types, func_type->sig.result_types,
                 "function", "result");
      CheckTypes(loc, decl.sig.param_types, func_type->sig.param_types,
                 "function", "argument");
    }
  }
}